

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O1

void reduce_min<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  int *piVar1;
  code *pcVar2;
  double dVar3;
  undefined8 uVar4;
  pointer puVar5;
  pointer puVar6;
  char extraout_AL;
  bool bVar7;
  char extraout_AL_00;
  char extraout_AL_01;
  int iVar8;
  pointer __s;
  value_type_conflict2 *__val;
  Executor *this;
  pointer *__ptr;
  default_delete<tf::Node> *this_00;
  long lVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 uVar11;
  int smin;
  undefined4 local_34c;
  int pmin;
  in_place_type_t<tf::Node::Runtime> local_342;
  DefaultTaskParams local_341;
  Expression_lhs<const_int_&> local_340;
  Result local_330;
  ResultBuilder DOCTEST_RB;
  vector<int,_std::allocator<int>_> vec;
  Task ptask;
  iterator beg;
  undefined8 local_270 [2];
  iterator end;
  Task stask;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  if (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(4000);
  lVar9 = 0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = __s;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = __s;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 1000;
  memset(__s,0,4000);
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       __s + 1000;
  do {
    iVar8 = rand();
    *(int *)((long)__s + lVar9) = iVar8 % 100 + -0x32;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 4000);
  local_270[0] = 1;
  if (4 < (ulong)((long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    lVar9 = 0;
    do {
      do {
        puVar6 = taskflow._graph.
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar5 = taskflow._graph.
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = *(int *)((long)&DAT_0016cca8 + lVar9);
        smin = 0x7fffffff;
        pmin = 0x7fffffff;
        beg._M_current =
             vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        end._M_current =
             vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        this_00 = (default_delete<tf::Node> *)
                  taskflow._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_270[1] = lVar9;
        if (taskflow._graph.
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            .
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            taskflow._graph.
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            .
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            if (*(Node **)this_00 != (Node *)0x0) {
              std::default_delete<tf::Node>::operator()(this_00,*(Node **)this_00);
            }
            *(undefined8 *)this_00 = 0;
            this_00 = this_00 + 8;
          } while (this_00 != (default_delete<tf::Node> *)puVar6);
          taskflow._graph.
          super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          .
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar5;
        }
        DOCTEST_RB.super_AssertData._8_8_ = &vec;
        DOCTEST_RB.super_AssertData._24_8_ = local_270;
        DOCTEST_RB.super_AssertData.m_expr = (char *)&smin;
        local_330.m_passed = false;
        local_330._1_7_ = 0;
        local_340.lhs = (int *)0x0;
        ptask._node = ptask._node & 0xffffffff00000000;
        DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&beg;
        DOCTEST_RB.super_AssertData.m_file = (char *)&end;
        stask._node = tf::Graph::
                      _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Static>,reduce_min<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda()_1_>
                                (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,
                                 &tf::ESTATE::NONE,(DefaultTaskParams *)&local_34c,
                                 (void **)&local_330,&local_340.lhs,(int *)&ptask,
                                 (in_place_type_t<tf::Node::Static> *)&local_341,
                                 (anon_class_40_5_697928ac *)&DOCTEST_RB);
        ptask._node = (Node *)0x0;
        DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&pmin;
        DOCTEST_RB.super_AssertData.m_file = (char *)&end;
        DOCTEST_RB.super_AssertData.m_expr._4_4_ = 0x3c23d70a;
        DOCTEST_RB.super_AssertData.m_failed = false;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData._42_2_ = 0x3f00;
        local_330.m_passed = false;
        local_330._1_7_ = 0;
        local_340.lhs = (int *)0x0;
        local_34c = 0;
        DOCTEST_RB.super_AssertData._8_8_ = (TestCaseData *)&beg;
        DOCTEST_RB.super_AssertData._24_8_ = (long)iVar8;
        ptask._node = tf::Graph::
                      _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_reduce_task<std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,int,reduce_min<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(int&,int&)_1_,tf::RandomPartitioner<tf::DefaultClosureWrapper>>(std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,int&,reduce_min<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(int&,int&)_1_,tf::RandomPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
                                (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,
                                 &tf::ESTATE::NONE,&local_341,(void **)&local_330,&local_340.lhs,
                                 (int *)&local_34c,&local_342,
                                 (anon_class_56_5_c33b3b7e *)&DOCTEST_RB);
        tf::Task::precede<tf::Task&>(&stask,&ptask);
        local_330.m_passed = true;
        local_330._1_7_ = 0;
        this = &executor;
        tf::Executor::
        run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
                  ((Future<void> *)&DOCTEST_RB,this,&taskflow,(anon_class_8_1_69701ed9 *)&local_330,
                   (anon_class_1_0_00000001 *)&local_340);
        if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) {
          std::__throw_future_error(3);
LAB_001334e6:
          doctest::detail::throwException();
        }
        std::__future_base::_State_baseV2::wait
                  ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,this);
        if (DOCTEST_RB.super_AssertData._24_8_ != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
            iVar8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar8 = *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
            *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc) = iVar8 + -1;
          }
          if (iVar8 == 1) {
            (**(code **)(*(long *)DOCTEST_RB.super_AssertData._24_8_ + 0x18))();
          }
        }
        if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     DOCTEST_RB.super_AssertData._8_8_);
        }
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x51;
        DOCTEST_RB.super_AssertData.m_expr._0_4_ = 0x16f8e7;
        DOCTEST_RB.super_AssertData.m_expr._4_4_ = 0;
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        local_340.m_at = DT_REQUIRE;
        local_34c = 0x7fffffff;
        local_340.lhs = &smin;
        doctest::detail::Expression_lhs<int_const&>::operator!=
                  (&local_330,(Expression_lhs<int_const&> *)&local_340,(int *)&local_34c);
        doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_330.m_decomp);
        DOCTEST_RB.super_AssertData.m_failed = (bool)(local_330.m_passed ^ 1);
        uVar10 = extraout_XMM0_Da;
        uVar11 = extraout_XMM0_Db;
        if ((local_330.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_330.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_330.m_decomp.field_0.data.ptr);
          uVar10 = extraout_XMM0_Da_00;
          uVar11 = extraout_XMM0_Db_00;
        }
        dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar11,uVar10));
        if (extraout_AL != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        if (DOCTEST_RB.super_AssertData.m_failed == true) {
          bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
          if (bVar7) goto LAB_001334e6;
        }
        if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)
           ) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0])
                           );
        }
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x52;
        DOCTEST_RB.super_AssertData.m_expr._0_4_ = 0x16f90f;
        DOCTEST_RB.super_AssertData.m_expr._4_4_ = 0;
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        local_340.lhs = &pmin;
        local_340.m_at = DT_REQUIRE;
        local_34c = 0x7fffffff;
        doctest::detail::Expression_lhs<int_const&>::operator!=
                  (&local_330,(Expression_lhs<int_const&> *)&local_340,(int *)&local_34c);
        doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_330.m_decomp);
        DOCTEST_RB.super_AssertData.m_failed = (bool)(local_330.m_passed ^ 1);
        uVar10 = extraout_XMM0_Da_01;
        uVar11 = extraout_XMM0_Db_01;
        if ((local_330.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_330.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_330.m_decomp.field_0.data.ptr);
          uVar10 = extraout_XMM0_Da_02;
          uVar11 = extraout_XMM0_Db_02;
        }
        dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar11,uVar10));
        if (extraout_AL_00 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        if (DOCTEST_RB.super_AssertData.m_failed == true) {
          bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
          if (bVar7) {
            doctest::detail::throwException();
          }
        }
        if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)
           ) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0])
                           );
        }
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x53;
        DOCTEST_RB.super_AssertData.m_expr._0_4_ = 0x16f937;
        DOCTEST_RB.super_AssertData.m_expr._4_4_ = 0;
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        local_340.m_at = DT_REQUIRE;
        local_340.lhs = &smin;
        doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                  (&local_330,&local_340,&pmin);
        uVar4 = local_270[1];
        doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_330.m_decomp);
        DOCTEST_RB.super_AssertData.m_failed = (bool)(local_330.m_passed ^ 1);
        uVar10 = extraout_XMM0_Da_03;
        uVar11 = extraout_XMM0_Db_03;
        if ((local_330.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_330.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_330.m_decomp.field_0.data.ptr);
          uVar10 = extraout_XMM0_Da_04;
          uVar11 = extraout_XMM0_Db_04;
        }
        dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar11,uVar10));
        if (extraout_AL_01 != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        if (DOCTEST_RB.super_AssertData.m_failed == true) {
          bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
          if (bVar7) {
            doctest::detail::throwException();
          }
        }
        if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)
           ) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0])
                           );
        }
        lVar9 = uVar4 + 4;
      } while (lVar9 != 0x14);
      local_270[0] = local_270[0] + 1;
      lVar9 = 0;
    } while ((ulong)local_270[0] <
             (ulong)((long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  if (vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tf::Taskflow::~Taskflow(&taskflow);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void reduce_min(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> vec(1000);

  for(auto& i : vec) i = ::rand() % 100 - 50;

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      int smin = std::numeric_limits<int>::max();
      int pmin = std::numeric_limits<int>::max();
      auto beg = vec.end();
      auto end = vec.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg = vec.begin();
        end = vec.begin() + n;
        for(auto itr = beg; itr != end; itr++) {
          smin = std::min(*itr, smin);
        }
      });

      tf::Task ptask;

      ptask = taskflow.reduce(
        std::ref(beg), std::ref(end), pmin, [](int& l, int& r){
        return std::min(l, r);
      }, P(c));

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(smin != std::numeric_limits<int>::max());
      REQUIRE(pmin != std::numeric_limits<int>::max());
      REQUIRE(smin == pmin);
    }
  }
}